

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::DumpEmpty
               (OpCode op,OpLayoutEmpty *data,FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  PropertyIdArray *pPVar1;
  ScriptContext *this;
  PropertyRecord *pPVar2;
  undefined6 in_register_0000003a;
  long lVar3;
  ulong uVar4;
  
  if ((int)CONCAT62(in_register_0000003a,op) != 0xdc) {
    return;
  }
  pPVar1 = FunctionBody::GetFormalsPropIdArray(dumpFunction,true);
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  Output::Print(L" %d [",(ulong)pPVar1->count);
  if (pPVar1->count != 0) {
    lVar3 = 2;
    uVar4 = 0;
    do {
      pPVar2 = ScriptContext::GetPropertyName(this,(&pPVar1->count)[lVar3]);
      if (lVar3 != 2) {
        Output::Print(L", ");
      }
      Output::Print(L"%s",pPVar2 + 1);
      if (1 < uVar4) break;
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 1;
    } while (uVar4 < pPVar1->count);
  }
  Output::Print(L"]");
  return;
}

Assistant:

void ByteCodeDumper::DumpEmpty(OpCode op, const unaligned OpLayoutEmpty * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::CommitScope:
            {
                const Js::PropertyIdArray *propIds = dumpFunction->GetFormalsPropIdArray();
                ScriptContext* scriptContext = dumpFunction->GetScriptContext();
                Output::Print(_u(" %d ["), propIds->count);
                for (uint i = 0; i < propIds->count && i < 3; i++)
                {
                    PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(propIds->elements[i]);
                    if (i != 0)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%s"), pPropertyName->GetBuffer());
                }
                Output::Print(_u("]"));
                break;
            }
        }
    }